

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfGetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  long lVar1;
  uint uVar2;
  ulong *puVar3;
  char in_AL;
  int iVar4;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  long *plVar9;
  size_t sVar10;
  double *pdVar11;
  double *pdVar12;
  int64_t iVar13;
  char *pcVar14;
  uint *puVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  void *pvVar22;
  int iVar23;
  ulong uVar24;
  double dVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  double *wrd;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  undefined4 in_XMM0_Da;
  float fVar34;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000010;
  va_list VarArg;
  aiocb local_5f60;
  ulong local_5f38;
  long local_5f30;
  ulong local_5f28;
  long local_5f20;
  long local_5f18;
  ulong local_5f10;
  long local_5f08;
  long local_5f00;
  ulong local_5ef8;
  double *local_5ef0;
  double *local_5ee8;
  double *local_5ee0;
  ulong local_5ed8;
  long local_5ed0;
  void *local_5ec8;
  ulong local_5ec0;
  ulong local_5eb8;
  ulong local_5eb0;
  uint local_5ea8 [12];
  undefined4 local_5e78;
  undefined8 local_5e68;
  undefined8 local_5e58;
  undefined8 local_5e48;
  undefined8 local_5e38;
  undefined8 local_5e28;
  undefined8 local_5e18;
  undefined8 local_5e08;
  int UsrTyp [1000];
  size_t UsrLen [1000];
  int FilTyp [1000];
  char *UsrBas [1000];
  
  if (in_AL != '\0') {
    local_5e78 = in_XMM0_Da;
    local_5e68 = in_XMM1_Qa;
    local_5e58 = in_XMM2_Qa;
    local_5e48 = in_XMM3_Qa;
    local_5e38 = in_XMM4_Qa;
    local_5e28 = in_XMM5_Qa;
    local_5e18 = in_XMM6_Qa;
    local_5e08 = in_XMM7_Qa;
  }
  iVar4 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  iVar23 = 0;
  iVar5 = 0;
  if ((0xffffff0f < KwdCod - 0xf1U) && (iVar4 == 0)) {
    lVar1 = MshIdx + (long)KwdCod * 0x3300;
    iVar5 = iVar23;
    if ((*(ulong *)(lVar1 + 0x10d8) != 0) &&
       ((((*(uint *)(lVar1 + 0x110) & 0xfffffffe) == 2 &&
         (uVar32 = BegIdx - 1, uVar32 < (ulong)EndIdx)) &&
        ((ulong)EndIdx <= *(ulong *)(lVar1 + 0x10d8))))) {
      pvVar6 = (void *)0x0;
      if (MapTyp == 10) {
        pvVar22 = (void *)0x0;
        pvVar6 = MapTab;
      }
      else {
        pvVar22 = MapTab;
        if (MapTyp != 0xb) {
          pvVar22 = pvVar6;
        }
      }
      VarArg[0].overflow_arg_area = &stack0x00000010;
      if (prc == (void *)0x0) {
        uVar7 = 0;
      }
      else {
        VarArg[0].overflow_arg_area = &stack0x00000018;
        uVar7 = in_stack_00000010;
      }
      if ((*(uint *)(lVar1 + 0x110) & 0xfffffffe) != 2) {
        iVar5 = -0x24;
        goto LAB_001094fc;
      }
      lVar21 = EndIdx - BegIdx;
      uVar20 = *VarArg[0].overflow_arg_area;
      local_5ed8 = (ulong)uVar20;
      local_5ed0 = lVar21;
      local_5ec8 = pvVar22;
      local_5ec0 = uVar32;
      puVar3 = (ulong *)((long)VarArg[0].overflow_arg_area + 8);
      if (uVar20 == 100) {
        local_5ed8 = *(ulong *)((long)VarArg[0].overflow_arg_area + 8);
        local_5ed0 = *(long *)((long)VarArg[0].overflow_arg_area + 0x10);
        local_5ec8 = *(void **)((long)VarArg[0].overflow_arg_area + 0x20);
        local_5ec0 = *(ulong *)((long)VarArg[0].overflow_arg_area + 0x18);
        puVar3 = (ulong *)((long)VarArg[0].overflow_arg_area + 0x28);
      }
      VarArg[0].overflow_arg_area = puVar3;
      uVar28 = 0x30;
      lVar17 = lVar21 + 1;
      uVar2 = *(uint *)(lVar1 + 0x11c);
      bVar33 = true;
      iVar5 = 0;
      uVar16 = uVar20;
      uVar26 = uVar28;
      for (iVar4 = 0; iVar4 < (int)uVar2; iVar4 = iVar4 + iVar29) {
        if (uVar20 == 100) {
          lVar8 = (long)iVar5;
          uVar16 = *(uint *)(local_5ed8 + lVar8 * 4);
          if ((uVar16 & 0xfffffffc) == 0xc) {
            uVar16 = uVar16 - 4;
            iVar23 = *(int *)(local_5ed0 + lVar8 * 4);
          }
          else if (uVar16 - 1 < 4) {
            iVar23 = *(int *)(MshIdx + 0x1c + (ulong)uVar16 * 4);
            uVar16 = *(int *)(MshIdx + 4) == 1 ^ 9;
          }
          else {
            iVar23 = 1;
          }
          lVar27 = *(long *)(local_5ec0 + lVar8 * 8);
          plVar9 = (long *)((long)local_5ec8 + lVar8 * 8);
          iVar5 = iVar5 + 1;
        }
        else {
          if (!bVar33) {
            if (uVar26 < 0x29) {
              uVar28 = uVar26 + 8;
              puVar15 = (uint *)((long)local_5ea8 + (ulong)uVar26);
              uVar26 = uVar28;
            }
            else {
              puVar15 = (uint *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar16 = *puVar15;
          }
          uVar30 = (ulong)uVar28;
          uVar31 = (ulong)uVar26;
          if ((uVar16 & 0xfffffffc) == 0xc) {
            if (uVar26 < 0x29) {
              uVar26 = uVar26 + 8;
              uVar30 = (ulong)uVar26;
              piVar18 = (int *)((long)local_5ea8 + uVar31);
            }
            else {
              piVar18 = (int *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar16 = uVar16 - 4;
            iVar23 = *piVar18;
          }
          else if (uVar16 - 1 < 4) {
            iVar23 = *(int *)(MshIdx + 0x1c + (ulong)uVar16 * 4);
            uVar16 = *(int *)(MshIdx + 4) == 1 ^ 9;
          }
          else {
            iVar23 = 1;
          }
          if (uVar26 < 0x29) {
            uVar30 = (ulong)(uVar26 + 8);
            plVar9 = (long *)((long)local_5ea8 + (ulong)uVar26);
          }
          else {
            plVar9 = (long *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          lVar27 = *plVar9;
          uVar28 = (uint)uVar30;
          if (uVar28 < 0x29) {
            uVar28 = uVar28 + 8;
            plVar9 = (long *)((long)local_5ea8 + uVar30);
          }
          else {
            plVar9 = (long *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          bVar33 = false;
          uVar26 = uVar28;
        }
        if (lVar17 < 2) {
          sVar10 = 0;
        }
        else {
          sVar10 = (*plVar9 - lVar27) / lVar21;
        }
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        for (lVar8 = 0; iVar29 = (int)lVar8, iVar23 != iVar29; lVar8 = lVar8 + 1) {
          UsrTyp[iVar4 + lVar8] = uVar16;
          UsrBas[iVar4 + lVar8] =
               (char *)((long)iVar29 * (long)*(int *)(&DAT_0010c520 + (long)(int)(uVar16 - 8) * 4) +
                       lVar27);
          UsrLen[iVar4 + lVar8] = sVar10;
        }
      }
      uVar19 = 0;
      uVar30 = uVar19;
      uVar31 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar31 = uVar19;
      }
      for (; uVar31 != uVar19; uVar19 = uVar19 + 1) {
        if (*(char *)(lVar1 + 0x10e8 + uVar19) == 'r') {
          bVar33 = *(int *)(MshIdx + 0x18) != 0x20;
          uVar24 = (ulong)bVar33;
          uVar20 = bVar33 + 8;
        }
        else {
          bVar33 = *(int *)(MshIdx + 4) < 4;
          uVar20 = bVar33 ^ 0xb;
          uVar24 = (ulong)bVar33 ^ 3;
        }
        FilTyp[uVar19] = uVar20;
        uVar30 = uVar30 + (long)*(int *)(&DAT_0010c520 + uVar24 * 4);
      }
      local_5eb0 = uVar32;
      SetFilPos((GmfMshSct *)MshIdx,*(int64_t *)(lVar1 + 0x10e0));
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        pdVar11 = (double *)malloc(uVar30 * 10000);
        if (pdVar11 == (double *)0x0) {
          iVar5 = -0x25;
LAB_001094fc:
          longjmp((__jmp_buf_tag *)(MshIdx + 0x48),iVar5);
        }
        pdVar12 = (double *)malloc(uVar30 * 10000);
        if (pdVar12 == (double *)0x0) {
          iVar5 = -0x26;
          goto LAB_001094fc;
        }
        local_5f60.aio_nbytes = 0;
        local_5f60.aio_lio_opcode = 0;
        local_5f60._36_4_ = 0;
        local_5f60.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_5f60.aio_buf = pdVar11;
        local_5ee8 = pdVar12;
        local_5ee0 = pdVar12;
        iVar13 = GetFilPos((GmfMshSct *)MshIdx);
        local_5f60.aio_offset = local_5eb0 * uVar30 + iVar13;
        uVar19 = lVar17 / 10000;
        uVar24 = 0;
        pdVar12 = pdVar11;
        uVar32 = uVar24;
        uVar31 = uVar24;
        local_5ef0 = pdVar11;
        local_5eb8 = uVar30;
        while (uVar31 <= uVar19 + 1) {
          if (uVar31 != 0) {
            if (local_5f60.aio_lio_opcode != 0) {
              if (local_5f60.aio_lio_opcode == 0x73) {
                do {
                } while( true );
              }
              pcVar14 = strerror(local_5f60.aio_lio_opcode);
              printf(" Error at aio_error() : %s\n",pcVar14);
              iVar5 = -0x27;
              goto LAB_001094fc;
            }
            local_5f60.aio_offset = local_5f60.aio_offset + local_5f60.aio_nbytes;
            bVar33 = (double *)local_5f60.aio_buf == pdVar11;
            pdVar12 = local_5ee8;
            local_5f60.aio_buf = pdVar11;
            if (bVar33) {
              pdVar12 = pdVar11;
              local_5f60.aio_buf = local_5ee8;
            }
          }
          local_5ef8 = uVar31;
          if (uVar19 < uVar31) {
LAB_0010916f:
            local_5f08 = (uVar31 - 1) * -10000 + lVar17;
            if (uVar31 - 1 != uVar19) {
              local_5f08 = 10000;
            }
            local_5f00 = uVar24 + 1;
            lVar21 = 0;
            wrd = pdVar12;
            local_5f18 = 0;
            if (0 < local_5f08) {
              local_5f18 = local_5f08;
            }
            while (lVar21 != local_5f18) {
              uVar31 = uVar32 + 1;
              local_5f20 = lVar21;
              local_5f10 = uVar32;
              for (uVar30 = 0; (long)uVar30 < (long)*(int *)(lVar1 + 0x11c); uVar30 = uVar30 + 1) {
                if (*(int *)(MshIdx + 0x10) != 1) {
                  SwpWrd((char *)wrd,*(int *)("errno      = %d\n" + (long)FilTyp[uVar30] * 4 + 9));
                }
                if ((*(long *)(lVar1 + 0x10c8) == 0) || (uVar30 == *(int *)(lVar1 + 0x11c) - 1)) {
                  iVar5 = (int)uVar30;
                }
                else {
                  iVar5 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar30 * 4);
                }
                pcVar14 = UsrBas[iVar5];
                if (pvVar6 == (void *)0x0) {
                  if (pvVar22 != (void *)0x0) {
                    lVar21 = *(long *)((long)pvVar22 + uVar31 * 8);
                    goto LAB_0010926b;
                  }
                  lVar21 = UsrLen[iVar5] * local_5f10;
                }
                else {
                  lVar21 = (long)*(int *)((long)pvVar6 + uVar31 * 4);
LAB_0010926b:
                  lVar21 = (lVar21 + -1) * UsrLen[iVar5];
                }
                iVar5 = FilTyp[uVar30];
                switch(iVar5) {
                case 8:
                  fVar34 = *(float *)wrd;
                  if (UsrTyp[uVar30] != 8) {
                    dVar25 = (double)fVar34;
                    goto LAB_001092e8;
                  }
LAB_0010930e:
                  *(float *)(pcVar14 + lVar21) = fVar34;
                  break;
                case 9:
                  dVar25 = *wrd;
                  if (UsrTyp[uVar30] != 9) {
                    fVar34 = (float)dVar25;
                    goto LAB_0010930e;
                  }
LAB_001092e8:
                  *(double *)(pcVar14 + lVar21) = dVar25;
                  break;
                case 10:
                  dVar25 = (double)(ulong)(uint)*(float *)wrd;
                  if (UsrTyp[uVar30] != 10) {
                    dVar25 = (double)(long)(int)*(float *)wrd;
                    goto LAB_001092d1;
                  }
LAB_00109305:
                  *(int *)(pcVar14 + lVar21) = SUB84(dVar25,0);
                  break;
                case 0xb:
                  dVar25 = *wrd;
                  if (UsrTyp[uVar30] != 0xb) goto LAB_00109305;
LAB_001092d1:
                  *(double *)(pcVar14 + lVar21) = dVar25;
                }
                wrd = (double *)
                      ((long)wrd + (long)*(int *)("errno      = %d\n" + (long)iVar5 * 4 + 9));
              }
              uVar32 = uVar31;
              lVar21 = local_5f20 + 1;
            }
            uVar24 = local_5f08 + uVar24;
            if (prc != (void *)0x0) {
              (*(code *)prc)(local_5f00,uVar24,uVar7);
            }
          }
          else {
            lVar21 = uVar31 * -10000 + lVar17;
            if (uVar31 != uVar19) {
              lVar21 = 10000;
            }
            local_5f60.aio_nbytes = lVar21 * local_5eb8;
            local_5f38 = uVar32;
            iVar5 = my_aio_read(&local_5f60);
            if (iVar5 == -1) {
              printf("block      = %zd / %zd\n",uVar31 + 1,uVar19 + 1);
              printf("size       = %ld lines\n",lVar21);
              printf("aio_fildes = %p\n",local_5f60.aio_fildes);
              printf("aio_buf    = %p\n",local_5f60.aio_buf);
              printf("aio_offset = %ld\n",local_5f60.aio_offset);
              printf("aio_nbytes = %ld\n",local_5f60.aio_nbytes);
              puVar15 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar15);
              iVar5 = -0x29;
              goto LAB_001094fc;
            }
            uVar32 = local_5f38;
            if (uVar31 != 0) goto LAB_0010916f;
          }
          uVar31 = local_5ef8 + 1;
        }
        free(local_5ef0);
        free(local_5ee0);
      }
      else {
        local_5f28 = 1;
        uVar32 = local_5f28;
        while (local_5f28 <= (ulong)EndIdx) {
          local_5f30 = uVar32 - 1;
          uVar30 = 0;
          while (uVar31 = local_5f28, (long)uVar30 < (long)*(int *)(lVar1 + 0x11c)) {
            if (uVar30 == *(int *)(lVar1 + 0x11c) - 1 || *(long *)(lVar1 + 0x10c8) == 0) {
              iVar5 = (int)uVar30;
            }
            else {
              iVar5 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar30 * 4);
            }
            if (pvVar6 == (void *)0x0) {
              if (pvVar22 != (void *)0x0) {
                lVar21 = *(long *)((long)pvVar22 + uVar32 * 8);
                goto LAB_00109415;
              }
              lVar21 = UsrLen[iVar5] * local_5f30;
            }
            else {
              lVar21 = (long)*(int *)((long)pvVar6 + uVar32 * 4);
LAB_00109415:
              lVar21 = (lVar21 + -1) * UsrLen[iVar5];
            }
            iVar5 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),
                                    &DAT_0010b230 + (int)(&UINT_0010b210)[UsrTyp[uVar30]],
                                    UsrBas[iVar5] + lVar21);
            uVar30 = uVar30 + 1;
            if (iVar5 != 1) {
              iVar5 = -1;
              goto LAB_001094fc;
            }
          }
          uVar32 = (uVar32 + 1) - (ulong)(local_5f28 < (ulong)BegIdx);
          if (prc != (void *)0x0) {
            (*(code *)prc)(1,*(undefined8 *)(lVar1 + 0x10d8),uVar7);
          }
          local_5f28 = uVar31 + 1;
        }
      }
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int GmfGetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ], *FilPos, *EndUsrDat;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL, *BegUsrDat;
   char        *StrTab[4] = { "%f", "%lf", "%d", INT64_T_FMT };
   char        **BegTab, **EndTab;
   int         i, j, k, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         *IntMapTab = NULL, err, TotSiz = 0, IniFlg = 1, mod = GmfArgLst;
   int         *TypTab, *SizTab, typ, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     BlkNmbLin, *FilPtrI64, *UsrPtrI64, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *LngMapTab = NULL, OldIdx = 0, UsrNmbLin, VecLen;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, b, l, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(BckBuf)
         free(BckBuf);

      if(FrtBuf)
         free(FrtBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be read
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's preprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -36);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            // In case the type is a vector, get its size and change
            // the type for the corresponding scalar type
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = (size_t)(EndUsrDat - BegUsrDat);
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Move file pointer to the keyword data
   SetFilPos(msh, kwd->pos);

   // Read the whole kwd data
   if(msh->typ & Asc)
   {
      OldIdx = 1;

      for(l=1;l<=FilEndIdx;l++)
      {
         for(j=0;j<kwd->SolSiz;j++)
         {
            // Reorder HO nodes on the fly
            if(kwd->OrdTab && (j != kwd->SolSiz-1))
               k = kwd->OrdTab[j];
            else
               k = j;

            // Move to the next user's data line only when the desired
            // begining position in the ascii file has been reached since
            // we cannot move directly to an arbitrary position
            if(IntMapTab)
               UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
            else
               UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

            safe_fscanf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], UsrDat[j], msh->err);
         }

         if(l >= FilBegIdx)
            OldIdx++;

         // Call the user's preprocessing procedure
         if(UsrPrc)
            UsrPrc(1, kwd->NmbLin, UsrArg);
      }
   }
   else
   {
      // Allocate both front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -37);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -38);

      // Setup the ansynchonous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
      aio.aio_buf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)(GetFilPos(msh) + (FilBegIdx-1) * LinSiz);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Wait for the previous block read to complete except
         // for the first loop interation
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -39);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -40);
            }

            // Increment the reading position
            aio.aio_offset += (size_t)aio.aio_nbytes;

            // and swap the buffers
            if(aio.aio_buf == BckBuf)
            {
               aio.aio_buf = FrtBuf;
               FilBuf = BckBuf;
            }
            else
            {
               aio.aio_buf = BckBuf;
               FilBuf = FrtBuf;
            }
         }
 
         // Read a chunk of data except for the last loop interarion
         if(b <= NmbBlk)
         {
            // The last block is shorter than the others
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            aio.aio_nbytes = BlkNmbLin * LinSiz;

            if(my_aio_read(&aio) == -1)
            {
               printf("block      = %zd / %zd\n", b+1, NmbBlk+1);
               printf("size       = "INT64_T_FMT" lines\n", BlkNmbLin);
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -41);
            }
         }

         // Then decode the block and store it in the user's data structure
         // except for the first loop interation
         if(b)
         {
            // The last block is shorter than the others
            if(b-1 == NmbBlk)
               BlkNmbLin = UsrNmbLin - (b-1) * BufSiz;
            else
               BlkNmbLin = BufSiz;

            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;
            FilPos = FilBuf;

            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(msh->cod != 1)
                     SwpWrd(FilPos, TypSiz[ FilTyp[j] - GmfFloat ]);

                  // Reorder HO nodes on the fly
                  if(kwd->OrdTab && (j != kwd->SolSiz-1))
                     k = kwd->OrdTab[j];
                  else
                     k = j;

                  if(IntMapTab)
                     UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else
                     UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = *FilPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = (int64_t)*FilPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = *FilPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = (int)*FilPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = *FilPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = (double)*FilPtrR32;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = *FilPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = (float)*FilPtrR64;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }

            // Call the user's preprocessing procedure
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);
         }
      }

      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}